

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opcodes_llvm_builtins.cpp
# Opt level: O0

Id dxil_spv::emit_boolean_convert_instruction<LLVMBC::ConstantExpr>
             (Impl *impl,ConstantExpr *instruction,bool is_signed)

{
  ConstantExpr *pCVar1;
  bool bVar2;
  ushort uVar3;
  unsigned_short u;
  TypeID TVar4;
  uint uVar5;
  Id arg;
  Type *pTVar6;
  Operation *this;
  Constant *value;
  unsigned_long_long u_00;
  double local_88;
  float local_74;
  float local_64;
  Id local_58;
  Id local_54;
  initializer_list<unsigned_int> local_50;
  Operation *local_40;
  Operation *op;
  Id const_1;
  Id const_0;
  Builder *builder;
  ConstantExpr *pCStack_20;
  bool is_signed_local;
  ConstantExpr *instruction_local;
  Impl *impl_local;
  
  builder._7_1_ = is_signed;
  pCStack_20 = instruction;
  instruction_local = (ConstantExpr *)impl;
  _const_1 = Converter::Impl::builder(impl);
  pTVar6 = LLVMBC::Value::getType((Value *)pCStack_20);
  TVar4 = LLVMBC::Type::getTypeID(pTVar6);
  switch(TVar4) {
  case HalfTyID:
    bVar2 = Converter::Impl::support_native_fp16_operations((Impl *)instruction_local);
    if (bVar2) {
      op._4_4_ = spv::Builder::makeFloat16Constant(_const_1,0,false);
      uVar3 = 0;
      if ((builder._7_1_ & 1) != 0) {
        uVar3 = 0x8000;
      }
      op._0_4_ = spv::Builder::makeFloat16Constant(_const_1,uVar3 | 0x3c00,false);
    }
    else {
      op._4_4_ = spv::Builder::makeFloatConstant(_const_1,0.0,false);
      local_64 = -1.0;
      if ((builder._7_1_ & 1) == 0) {
        local_64 = 1.0;
      }
      op._0_4_ = spv::Builder::makeFloatConstant(_const_1,local_64,false);
    }
    break;
  case FloatTyID:
    op._4_4_ = spv::Builder::makeFloatConstant(_const_1,0.0,false);
    local_74 = -1.0;
    if ((builder._7_1_ & 1) == 0) {
      local_74 = 1.0;
    }
    op._0_4_ = spv::Builder::makeFloatConstant(_const_1,local_74,false);
    break;
  case DoubleTyID:
    op._4_4_ = spv::Builder::makeDoubleConstant(_const_1,0.0,false);
    local_88 = -1.0;
    if ((builder._7_1_ & 1) == 0) {
      local_88 = 1.0;
    }
    op._0_4_ = spv::Builder::makeDoubleConstant(_const_1,local_88,false);
    break;
  case IntegerTyID:
    pTVar6 = LLVMBC::Value::getType((Value *)pCStack_20);
    uVar5 = LLVMBC::Type::getIntegerBitWidth(pTVar6);
    uVar5 = physical_integer_bit_width(uVar5);
    if (uVar5 == 0x10) {
      op._4_4_ = spv::Builder::makeUint16Constant(_const_1,0,false);
      u = 1;
      if ((builder._7_1_ & 1) != 0) {
        u = 0xffff;
      }
      op._0_4_ = spv::Builder::makeUint16Constant(_const_1,u,false);
    }
    else if (uVar5 == 0x20) {
      op._4_4_ = spv::Builder::makeUintConstant(_const_1,0,false);
      uVar5 = 1;
      if ((builder._7_1_ & 1) != 0) {
        uVar5 = 0xffffffff;
      }
      op._0_4_ = spv::Builder::makeUintConstant(_const_1,uVar5,false);
    }
    else {
      if (uVar5 != 0x40) {
        return 0;
      }
      op._4_4_ = spv::Builder::makeUint64Constant(_const_1,0,false);
      u_00 = 1;
      if ((builder._7_1_ & 1) != 0) {
        u_00 = 0xffffffffffffffff;
      }
      op._0_4_ = spv::Builder::makeUint64Constant(_const_1,u_00,false);
    }
    break;
  default:
    return 0;
  }
  this = Converter::Impl::allocate((Impl *)instruction_local,OpSelect,(Value *)pCStack_20);
  pCVar1 = instruction_local;
  local_40 = this;
  value = LLVMBC::ConstantExpr::getOperand(pCStack_20,0);
  arg = Converter::Impl::get_id_for_value((Impl *)pCVar1,&value->super_Value,0);
  Operation::add_id(this,arg);
  local_58 = (Id)op;
  local_54 = op._4_4_;
  local_50._M_array = &local_58;
  local_50._M_len = 2;
  Operation::add_ids(local_40,&local_50);
  Converter::Impl::add((Impl *)instruction_local,local_40,false);
  pCVar1 = instruction_local;
  pTVar6 = LLVMBC::Value::getType((Value *)pCStack_20);
  Converter::Impl::decorate_relaxed_precision((Impl *)pCVar1,pTVar6,local_40->id,false);
  return local_40->id;
}

Assistant:

static spv::Id emit_boolean_convert_instruction(Converter::Impl &impl, const InstructionType *instruction, bool is_signed)
{
	auto &builder = impl.builder();
	spv::Id const_0;
	spv::Id const_1;

	switch (instruction->getType()->getTypeID())
	{
	case llvm::Type::TypeID::HalfTyID:
		if (impl.support_native_fp16_operations())
		{
			const_0 = builder.makeFloat16Constant(0);
			const_1 = builder.makeFloat16Constant(0x3c00u | (is_signed ? 0x8000u : 0u));
		}
		else
		{
			const_0 = builder.makeFloatConstant(0.0f);
			const_1 = builder.makeFloatConstant(is_signed ? -1.0f : 1.0f);
		}
		break;

	case llvm::Type::TypeID::FloatTyID:
		const_0 = builder.makeFloatConstant(0.0f);
		const_1 = builder.makeFloatConstant(is_signed ? -1.0f : 1.0f);
		break;

	case llvm::Type::TypeID::DoubleTyID:
		const_0 = builder.makeDoubleConstant(0.0);
		const_1 = builder.makeDoubleConstant(is_signed ? -1.0 : 1.0);
		break;

	case llvm::Type::TypeID::IntegerTyID:
		switch (physical_integer_bit_width(instruction->getType()->getIntegerBitWidth()))
		{
		case 16:
			const_0 = builder.makeUint16Constant(0);
			const_1 = builder.makeUint16Constant(is_signed ? 0xffff : 1u);
			break;

		case 32:
			const_0 = builder.makeUintConstant(0);
			const_1 = builder.makeUintConstant(is_signed ? 0xffffffffu : 1u);
			break;

		case 64:
			const_0 = builder.makeUint64Constant(0ull);
			const_1 = builder.makeUint64Constant(is_signed ? ~0ull : 1ull);
			break;

		default:
			return 0;
		}
		break;

	default:
		return 0;
	}

	Operation *op = impl.allocate(spv::OpSelect, instruction);
	op->add_id(impl.get_id_for_value(instruction->getOperand(0)));
	op->add_ids({ const_1, const_0 });
	impl.add(op);
	impl.decorate_relaxed_precision(instruction->getType(), op->id, false);
	return op->id;
}